

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O2

int jpc_pi_next(jpc_pi_t *pi)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  uint_fast32_t uVar4;
  uint_fast32_t uVar5;
  jpc_pirlvl_t *pjVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  jpc_picomp_t *pjVar12;
  ulong uVar13;
  ulong uVar14;
  uint *puVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  int *piVar19;
  jpc_pirlvl_t *pjVar20;
  ulong uVar21;
  jpc_pchg_t *pjVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  
  puVar1 = &pi->compno;
  pjVar22 = pi->pchg;
  do {
    pi->valid = false;
    if (pjVar22 == (jpc_pchg_t *)0x0) {
      iVar3 = pi->pchgno;
      iVar18 = iVar3 + 1;
      pi->pchgno = iVar18;
      pi->compno = 0;
      pi->rlvlno = 0;
      pi->prcno = 0;
      pi->lyrno = 0;
      pi->prgvolfirst = true;
      iVar10 = pi->pchglist->numpchgs;
      if (iVar18 < iVar10) {
        pjVar22 = pi->pchglist->pchgs[(long)iVar3 + 1];
      }
      else {
        pjVar22 = &pi->defaultpchg;
        if (iVar18 != iVar10) {
          return 1;
        }
      }
      pi->pchg = pjVar22;
    }
    switch(pjVar22->prgord) {
    case '\0':
      if (pi->prgvolfirst == false) {
        pjVar20 = pi->pirlvl;
        uVar11 = pi->prcno;
        puVar15 = pjVar20->prclyrnos + uVar11;
        goto LAB_0012c44c;
      }
      pi->prgvolfirst = false;
      uVar11 = 0;
      while ((pi->lyrno = uVar11, uVar11 < pi->numlyrs && ((ulong)uVar11 < pjVar22->lyrnoend))) {
        for (uVar11 = (uint)pjVar22->rlvlnostart;
            (pi->rlvlno = uVar11, uVar11 < pi->maxrlvls && (uVar11 < pjVar22->rlvlnoend));
            uVar11 = uVar11 + 1) {
          uVar21 = pjVar22->compnostart;
          pi->compno = (uint)uVar21;
          pjVar12 = pi->picomps + (uVar21 & 0xffffffff);
          while( true ) {
            pi->picomp = pjVar12;
            uVar17 = (uint)uVar21;
            if (pi->numcomps <= uVar17) break;
            uVar11 = pi->rlvlno;
            if (pjVar22->compnoend <= (uVar21 & 0xffffffff)) goto LAB_0012c43d;
            if (uVar11 < pjVar12->numrlvls) {
              pjVar6 = pjVar12->pirlvls;
              pjVar20 = pjVar6 + uVar11;
              pi->pirlvl = pjVar20;
              pi->prcno = 0;
              puVar15 = pjVar6[uVar11].prclyrnos;
              uVar11 = 0;
              while (uVar11 < pjVar20->numprcs) {
                uVar17 = pi->lyrno;
                if (*puVar15 <= uVar17) goto LAB_0012c473;
LAB_0012c44c:
                uVar11 = uVar11 + 1;
                pi->prcno = uVar11;
                puVar15 = puVar15 + 1;
              }
              uVar17 = pi->compno;
              pjVar12 = pi->picomp;
            }
            uVar21 = (ulong)(uVar17 + 1);
            *puVar1 = uVar17 + 1;
            pjVar12 = pjVar12 + 1;
          }
          uVar11 = pi->rlvlno;
LAB_0012c43d:
        }
        uVar11 = pi->lyrno + 1;
      }
      break;
    case '\x01':
      if (pi->prgvolfirst == false) {
        uVar11 = pi->prcno;
        uVar9 = pi->pirlvl->numprcs;
        if (uVar11 < uVar9) {
          puVar15 = pi->pirlvl->prclyrnos + uVar11;
          goto LAB_0012c39c;
        }
        __assert_fail("pi->prcno < pi->pirlvl->numprcs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2cod.c"
                      ,0xbe,"int jpc_pi_nextrlcp(jpc_pi_t *)");
      }
      pi->prgvolfirst = false;
      uVar11 = (uint)pjVar22->rlvlnostart;
      while ((pi->rlvlno = uVar11, uVar11 < pi->maxrlvls &&
             (uVar21 = 0, uVar11 < pjVar22->rlvlnoend))) {
        while ((pi->lyrno = (uint)uVar21, (uint)uVar21 < pi->numlyrs && (uVar21 < pjVar22->lyrnoend)
               )) {
          uVar21 = pjVar22->compnostart;
          pi->compno = (uint)uVar21;
          pjVar12 = pi->picomps + (uVar21 & 0xffffffff);
          while( true ) {
            pi->picomp = pjVar12;
            uVar11 = (uint)uVar21;
            if ((pi->numcomps <= uVar11) || (pjVar22->compnoend <= (uVar21 & 0xffffffff))) break;
            uVar17 = pi->rlvlno;
            if (uVar17 < pjVar12->numrlvls) {
              pjVar20 = pjVar12->pirlvls;
              pi->pirlvl = pjVar20 + uVar17;
              pi->prcno = 0;
              puVar15 = pjVar20[uVar17].prclyrnos;
              uVar9 = pjVar20[uVar17].numprcs;
              uVar11 = 0;
              while (uVar11 < uVar9) {
                uVar17 = pi->lyrno;
                if (*puVar15 <= uVar17) goto LAB_0012c473;
LAB_0012c39c:
                uVar11 = uVar11 + 1;
                pi->prcno = uVar11;
                puVar15 = puVar15 + 1;
              }
              uVar11 = pi->compno;
              pjVar12 = pi->picomp;
            }
            uVar21 = (ulong)(uVar11 + 1);
            *puVar1 = uVar11 + 1;
            pjVar12 = pjVar12 + 1;
          }
          uVar21 = (ulong)(pi->lyrno + 1);
        }
        uVar11 = pi->rlvlno + 1;
      }
      break;
    case '\x02':
      if (pi->prgvolfirst == false) {
        uVar11 = pi->lyrno;
        goto LAB_0012c2f2;
      }
      pi->xstep = 0;
      pi->ystep = 0;
      pjVar12 = pi->picomps;
      uVar24 = 0;
      uVar21 = 0;
      for (uVar11 = 0; uVar11 != pi->numcomps; uVar11 = uVar11 + 1) {
        uVar17 = pjVar12->numrlvls;
        piVar19 = &pjVar12->pirlvls->prcheightexpn;
        uVar9 = uVar17;
        while (uVar9 = uVar9 - 1, uVar9 != 0xffffffff) {
          if ((0x3e < piVar19[-1] + uVar17) || (iVar10 = *piVar19, 0x3e < iVar10 + uVar17))
          goto switchD_0012b944_default;
          uVar4 = pjVar12->vsamp;
          uVar23 = pjVar12->hsamp << ((char)piVar19[-1] + (char)uVar9 & 0x3fU) & 0xffffffff;
          uVar26 = uVar23;
          if (uVar21 < uVar23) {
            uVar26 = uVar21;
          }
          bVar27 = uVar21 == 0;
          uVar21 = uVar26;
          if (bVar27) {
            uVar21 = uVar23;
          }
          pi->xstep = uVar21;
          uVar23 = uVar4 << ((char)iVar10 + (char)uVar9 & 0x3fU) & 0xffffffff;
          uVar26 = uVar23;
          if (uVar24 < uVar23) {
            uVar26 = uVar24;
          }
          bVar27 = uVar24 == 0;
          uVar24 = uVar26;
          if (bVar27) {
            uVar24 = uVar23;
          }
          pi->ystep = uVar24;
          piVar19 = piVar19 + 8;
        }
        pjVar12 = pjVar12 + 1;
      }
      pi->prgvolfirst = false;
      uVar11 = (uint)pjVar22->rlvlnostart;
      while ((pi->rlvlno = uVar11, uVar11 < pjVar22->rlvlnoend && (uVar11 < pi->maxrlvls))) {
        uVar21 = pi->ystart;
        while (pi->y = uVar21, uVar21 < pi->yend) {
          uVar21 = pi->xstart;
          while (pi->x = uVar21, uVar21 < pi->xend) {
            uVar21 = pjVar22->compnostart;
            pi->compno = (uint)uVar21;
            pjVar12 = pi->picomps + (uVar21 & 0xffffffff);
            while( true ) {
              pi->picomp = pjVar12;
              if ((pjVar22->compnoend <= (uVar21 & 0xffffffff)) || (pi->numcomps <= (uint)uVar21))
              break;
              uVar11 = pi->rlvlno;
              uVar17 = pjVar12->numrlvls;
              if (uVar11 < uVar17) {
                pjVar6 = pjVar12->pirlvls;
                pjVar20 = pjVar6 + uVar11;
                pi->pirlvl = pjVar20;
                uVar9 = pjVar6[uVar11].numprcs;
                if (uVar9 != 0) {
                  bVar8 = (char)uVar17 + ~(byte)uVar11;
                  bVar2 = (byte)pjVar20->prcwidthexpn;
                  bVar16 = (byte)pjVar20->prcheightexpn;
                  uVar21 = pi->x;
                  uVar23 = pjVar12->hsamp << (bVar8 & 0x3f);
                  uVar24 = ((uVar23 + pi->xstart) - 1) / uVar23;
                  uVar25 = pjVar12->vsamp << (bVar8 & 0x3f);
                  uVar26 = ((uVar25 + pi->ystart) - 1) / uVar25;
                  if (uVar21 == pi->xstart) {
                    uVar13 = ~(-1L << (bVar2 + bVar8 & 0x3f));
                    if ((uVar24 << (bVar8 & 0x3f) & uVar13) == 0) goto LAB_0012c231;
                  }
                  else {
                    uVar13 = ~(-1L << (bVar2 + bVar8 & 0x3f));
LAB_0012c231:
                    if ((uVar13 & uVar21) != 0) goto LAB_0012c2f6;
                  }
                  uVar13 = pi->y;
                  if (uVar13 == pi->ystart) {
                    uVar14 = ~(-1L << (bVar16 + bVar8 & 0x3f));
                    if ((uVar26 << (bVar8 & 0x3f) & uVar14) == 0) goto LAB_0012c26c;
                  }
                  else {
                    uVar14 = ~(-1L << (bVar16 + bVar8 & 0x3f));
LAB_0012c26c:
                    if ((uVar14 & uVar13) != 0) goto LAB_0012c2f6;
                  }
                  uVar11 = 0;
                  uVar17 = ((int)((uVar13 + (uVar25 - 1)) / uVar25 >> (bVar16 & 0x3f)) -
                           (int)(uVar26 >> (bVar16 & 0x3f))) * pjVar20->numhprcs +
                           ((int)((uVar21 + (uVar23 - 1)) / uVar23 >> (bVar2 & 0x3f)) -
                           (int)(uVar24 >> (bVar2 & 0x3f)));
                  pi->prcno = uVar17;
                  if (uVar9 <= uVar17) goto switchD_0012b944_default;
                  for (; (pi->lyrno = uVar11, uVar11 < pi->numlyrs &&
                         ((ulong)uVar11 < pjVar22->lyrnoend)); uVar11 = uVar11 + 1) {
                    puVar15 = pi->pirlvl->prclyrnos;
                    uVar21 = (ulong)pi->prcno;
                    uVar17 = puVar15[uVar21];
                    if (uVar17 <= uVar11) goto LAB_0012c46f;
LAB_0012c2f2:
                  }
                }
              }
LAB_0012c2f6:
              uVar11 = pi->compno + 1;
              uVar21 = (ulong)uVar11;
              pi->compno = uVar11;
              pjVar12 = pi->picomp + 1;
            }
            uVar21 = (pi->x + pi->xstep) - pi->x % pi->xstep;
          }
          uVar21 = (pi->y + pi->ystep) - pi->y % pi->ystep;
        }
        uVar11 = pi->rlvlno + 1;
      }
      break;
    case '\x03':
      if (pi->prgvolfirst == false) {
        uVar11 = pi->lyrno;
        goto LAB_0012c0a4;
      }
      pi->xstep = 0;
      pi->ystep = 0;
      pjVar12 = pi->picomps;
      uVar11 = pi->numcomps;
      uVar24 = 0;
      uVar21 = 0;
      for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
        uVar9 = pjVar12->numrlvls;
        piVar19 = &pjVar12->pirlvls->prcheightexpn;
        uVar7 = uVar9;
        while (uVar7 = uVar7 - 1, uVar7 != 0xffffffff) {
          if ((0x3e < piVar19[-1] + uVar9) || (iVar10 = *piVar19, 0x3e < iVar10 + uVar9))
          goto switchD_0012b944_default;
          uVar4 = pjVar12->vsamp;
          uVar23 = pjVar12->hsamp << ((char)piVar19[-1] + (char)uVar7 & 0x3fU) & 0xffffffff;
          uVar26 = uVar23;
          if (uVar21 < uVar23) {
            uVar26 = uVar21;
          }
          bVar27 = uVar21 == 0;
          uVar21 = uVar26;
          if (bVar27) {
            uVar21 = uVar23;
          }
          pi->xstep = uVar21;
          uVar23 = uVar4 << ((char)iVar10 + (char)uVar7 & 0x3fU) & 0xffffffff;
          uVar26 = uVar23;
          if (uVar24 < uVar23) {
            uVar26 = uVar24;
          }
          bVar27 = uVar24 == 0;
          uVar24 = uVar26;
          if (bVar27) {
            uVar24 = uVar23;
          }
          pi->ystep = uVar24;
          piVar19 = piVar19 + 8;
        }
        pjVar12 = pjVar12 + 1;
      }
      pi->prgvolfirst = false;
      uVar21 = pi->ystart;
      while (pi->y = uVar21, uVar21 < pi->yend) {
        uVar21 = pi->xstart;
        while (pi->x = uVar21, uVar21 < pi->xend) {
          uVar21 = pjVar22->compnostart;
          pi->compno = (uint)uVar21;
          pjVar12 = pi->picomps + (uVar21 & 0xffffffff);
          while ((pi->picomp = pjVar12, (uint)uVar21 < uVar11 &&
                 ((uVar21 & 0xffffffff) < pjVar22->compnoend))) {
            bVar2 = pjVar22->rlvlnostart;
            uVar11 = (uint)bVar2;
            pi->rlvlno = (uint)bVar2;
            pjVar20 = pjVar12->pirlvls + bVar2;
            pi->pirlvl = pjVar20;
            while ((uVar11 < pjVar12->numrlvls && (uVar11 < pjVar22->rlvlnoend))) {
              uVar17 = pjVar20->numprcs;
              if (uVar17 != 0) {
                bVar16 = (char)pjVar12->numrlvls + ~(byte)uVar11;
                uVar21 = pi->x;
                uVar23 = pjVar12->hsamp << (bVar16 & 0x3f);
                uVar25 = pjVar12->vsamp << (bVar16 & 0x3f);
                uVar24 = ((uVar23 + pi->xstart) - 1) / uVar23;
                uVar26 = ((uVar25 + pi->ystart) - 1) / uVar25;
                bVar2 = (byte)pjVar20->prcwidthexpn;
                bVar8 = (byte)pjVar20->prcheightexpn;
                if ((((uVar21 == pi->xstart) &&
                     ((uVar24 << (bVar16 & 0x3f) & ~(-1L << (bVar2 + bVar16 & 0x3f))) != 0)) ||
                    (uVar21 % (pjVar12->hsamp << (bVar2 + bVar16 & 0x3f)) == 0)) &&
                   (((uVar13 = pi->y, uVar13 == pi->ystart &&
                     ((uVar26 << (bVar16 & 0x3f) & ~(-1L << (bVar8 + bVar16 & 0x3f))) != 0)) ||
                    (uVar13 % (pjVar12->vsamp << (bVar8 + bVar16 & 0x3f)) == 0)))) {
                  uVar14 = 0;
                  uVar11 = ((int)((uVar13 + (uVar25 - 1)) / uVar25 >> (bVar8 & 0x3f)) -
                           (int)(uVar26 >> (bVar8 & 0x3f))) * pjVar20->numhprcs +
                           ((int)((uVar21 + (uVar23 - 1)) / uVar23 >> (bVar2 & 0x3f)) -
                           (int)(uVar24 >> (bVar2 & 0x3f)));
                  pi->prcno = uVar11;
                  if (uVar17 <= uVar11) {
                    __assert_fail("pi->prcno < pi->pirlvl->numprcs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2cod.c"
                                  ,0x198,"int jpc_pi_nextpcrl(jpc_pi_t *)");
                  }
                  while( true ) {
                    uVar11 = (uint)uVar14;
                    pi->lyrno = uVar11;
                    if (pi->numlyrs <= uVar11) break;
                    pjVar20 = pi->pirlvl;
                    if (pjVar22->lyrnoend <= uVar14) goto LAB_0012c0ac;
                    puVar15 = pjVar20->prclyrnos;
                    uVar21 = (ulong)pi->prcno;
                    uVar17 = puVar15[uVar21];
                    if (uVar17 <= uVar11) goto LAB_0012c46f;
LAB_0012c0a4:
                    uVar14 = (ulong)(uVar11 + 1);
                  }
                  pjVar20 = pi->pirlvl;
                }
              }
LAB_0012c0ac:
              uVar11 = pi->rlvlno + 1;
              pi->rlvlno = uVar11;
              pjVar20 = pjVar20 + 1;
              pi->pirlvl = pjVar20;
              pjVar12 = pi->picomp;
            }
            uVar11 = pi->numcomps;
            uVar17 = pi->compno + 1;
            pi->compno = uVar17;
            pjVar12 = pjVar12 + 1;
            uVar21 = (ulong)uVar17;
          }
          uVar21 = (pi->x + pi->xstep) - pi->x % pi->xstep;
        }
        uVar21 = (pi->y + pi->ystep) - pi->y % pi->ystep;
      }
      break;
    case '\x04':
      if (pi->prgvolfirst == false) {
        uVar11 = pi->lyrno;
        goto LAB_0012be50;
      }
      pi->prgvolfirst = false;
      uVar21 = pjVar22->compnostart;
      pi->compno = (uint)uVar21;
      pjVar12 = pi->picomps + (uVar21 & 0xffffffff);
      while( true ) {
        pi->picomp = pjVar12;
        if ((pjVar22->compnoend <= (uVar21 & 0xffffffff)) || (pi->numcomps <= (uint)uVar21)) break;
        pjVar20 = pjVar12->pirlvls;
        uVar11 = pjVar12->numrlvls;
        uVar17 = pjVar20->prcwidthexpn + uVar11;
        if ((0x3e < uVar17) || (uVar9 = pjVar20->prcheightexpn + uVar11, 0x3e < uVar9)) break;
        uVar4 = pjVar12->hsamp;
        uVar24 = uVar4 << ((char)uVar17 - 1U & 0x3f);
        pi->xstep = uVar24;
        uVar5 = pjVar12->vsamp;
        uVar21 = uVar5 << ((char)uVar9 - 1U & 0x3f);
        pi->ystep = uVar21;
        piVar19 = &pjVar20[1].prcheightexpn;
        iVar10 = uVar11 - 2;
        for (uVar17 = 1; uVar17 < uVar11; uVar17 = uVar17 + 1) {
          uVar26 = uVar4 << ((char)piVar19[-1] + (char)iVar10 & 0x3fU);
          if (uVar26 <= uVar24) {
            uVar24 = uVar26;
          }
          pi->xstep = uVar24;
          uVar26 = uVar5 << ((char)*piVar19 + (char)iVar10 & 0x3fU);
          if (uVar26 <= uVar21) {
            uVar21 = uVar26;
          }
          pi->ystep = uVar21;
          piVar19 = piVar19 + 8;
          iVar10 = iVar10 + -1;
        }
        uVar21 = pi->ystart;
        while (pi->y = uVar21, uVar21 < pi->yend) {
          uVar21 = pi->xstart;
          while (pi->x = uVar21, uVar21 < pi->xend) {
            bVar2 = pjVar22->rlvlnostart;
            uVar17 = (uint)bVar2;
            pi->rlvlno = (uint)bVar2;
            pjVar20 = pjVar12->pirlvls + bVar2;
            pi->pirlvl = pjVar20;
            while ((uVar17 < uVar11 && (uVar17 < pjVar22->rlvlnoend))) {
              uVar9 = pjVar20->numprcs;
              if (uVar9 != 0) {
                bVar16 = (char)uVar11 + ~(byte)uVar17;
                uVar21 = pi->x;
                uVar23 = pjVar12->hsamp << (bVar16 & 0x3f);
                uVar25 = pjVar12->vsamp << (bVar16 & 0x3f);
                uVar24 = ((uVar23 + pi->xstart) - 1) / uVar23;
                uVar26 = ((uVar25 + pi->ystart) - 1) / uVar25;
                bVar2 = (byte)pjVar20->prcwidthexpn;
                bVar8 = (byte)pjVar20->prcheightexpn;
                if ((((uVar21 == pi->xstart) &&
                     ((uVar24 << (bVar16 & 0x3f) & ~(-1L << (bVar2 + bVar16 & 0x3f))) != 0)) ||
                    (uVar21 % (pjVar12->hsamp << (bVar2 + bVar16 & 0x3f)) == 0)) &&
                   (((uVar13 = pi->y, uVar13 == pi->ystart &&
                     ((uVar26 << (bVar16 & 0x3f) & ~(-1L << (bVar8 + bVar16 & 0x3f))) != 0)) ||
                    (uVar13 % (pjVar12->vsamp << (bVar8 + bVar16 & 0x3f)) == 0)))) {
                  uVar14 = 0;
                  uVar11 = ((int)((uVar13 + (uVar25 - 1)) / uVar25 >> (bVar8 & 0x3f)) -
                           (int)(uVar26 >> (bVar8 & 0x3f))) * pjVar20->numhprcs +
                           ((int)((uVar21 + (uVar23 - 1)) / uVar23 >> (bVar2 & 0x3f)) -
                           (int)(uVar24 >> (bVar2 & 0x3f)));
                  pi->prcno = uVar11;
                  if (uVar9 <= uVar11) {
                    __assert_fail("pi->prcno < pi->pirlvl->numprcs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2cod.c"
                                  ,0x1f6,"int jpc_pi_nextcprl(jpc_pi_t *)");
                  }
                  while( true ) {
                    uVar11 = (uint)uVar14;
                    pi->lyrno = uVar11;
                    if (pi->numlyrs <= uVar11) break;
                    pjVar20 = pi->pirlvl;
                    if (pjVar22->lyrnoend <= uVar14) goto LAB_0012be58;
                    puVar15 = pjVar20->prclyrnos;
                    uVar21 = (ulong)pi->prcno;
                    uVar17 = puVar15[uVar21];
                    if (uVar17 <= uVar11) goto LAB_0012c46f;
LAB_0012be50:
                    uVar14 = (ulong)(uVar11 + 1);
                  }
                  pjVar20 = pi->pirlvl;
                }
              }
LAB_0012be58:
              uVar17 = pi->rlvlno + 1;
              pi->rlvlno = uVar17;
              pjVar20 = pjVar20 + 1;
              pi->pirlvl = pjVar20;
              pjVar12 = pi->picomp;
              uVar11 = pjVar12->numrlvls;
            }
            uVar21 = (pi->x + pi->xstep) - pi->x % pi->xstep;
          }
          uVar21 = (pi->y + pi->ystep) - pi->y % pi->ystep;
        }
        uVar21 = (ulong)(*puVar1 + 1);
        *puVar1 = *puVar1 + 1;
        pjVar12 = pjVar12 + 1;
      }
    }
switchD_0012b944_default:
    pi->pchg = (jpc_pchg_t *)0x0;
    pjVar22 = (jpc_pchg_t *)0x0;
  } while( true );
LAB_0012c46f:
  puVar15 = puVar15 + uVar21;
LAB_0012c473:
  *puVar15 = uVar17 + 1;
  pi->valid = true;
  pi->pktno = pi->pktno + 1;
  return 0;
}

Assistant:

int jpc_pi_next(jpc_pi_t *pi)
{
	jpc_pchg_t *pchg;
	int ret;

	for (;;) {

		pi->valid = false;

		if (!pi->pchg) {
			++pi->pchgno;
			pi->compno = 0;
			pi->rlvlno = 0;
			pi->prcno = 0;
			pi->lyrno = 0;
			pi->prgvolfirst = true;
			if (pi->pchgno < jpc_pchglist_numpchgs(pi->pchglist)) {
				pi->pchg = jpc_pchglist_get(pi->pchglist, pi->pchgno);
			} else if (pi->pchgno == jpc_pchglist_numpchgs(pi->pchglist)) {
				pi->pchg = &pi->defaultpchg;
			} else {
				return 1;
			}
		}

		pchg = pi->pchg;
		switch (pchg->prgord) {
		case JPC_COD_LRCPPRG:
			ret = jpc_pi_nextlrcp(pi);
			break;
		case JPC_COD_RLCPPRG:
			ret = jpc_pi_nextrlcp(pi);
			break;
		case JPC_COD_RPCLPRG:
			ret = jpc_pi_nextrpcl(pi);
			break;
		case JPC_COD_PCRLPRG:
			ret = jpc_pi_nextpcrl(pi);
			break;
		case JPC_COD_CPRLPRG:
			ret = jpc_pi_nextcprl(pi);
			break;
		default:
			ret = -1;
			break;
		}
		if (!ret) {
			pi->valid = true;
			++pi->pktno;
			return 0;
		}
		pi->pchg = 0;
	}
}